

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  char *__dest;
  undefined8 uVar1;
  size_t sVar2;
  Curl_addrinfo *pCVar3;
  long lVar4;
  sockaddr *psVar5;
  long lVar6;
  int iVar7;
  Curl_addrinfo *pCVar8;
  Curl_addrinfo *pCVar9;
  char *local_48;
  
  if ((he != (hostent *)0x0) && (local_48 = *he->h_addr_list, local_48 != (char *)0x0)) {
    iVar7 = he->h_addrtype;
    lVar4 = 8;
    pCVar8 = (Curl_addrinfo *)0x0;
    pCVar9 = (Curl_addrinfo *)0x0;
    while( true ) {
      sVar2 = strlen(he->h_name);
      lVar6 = 0x10;
      if (iVar7 == 10) {
        lVar6 = 0x1c;
      }
      pCVar3 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar2 + lVar6 + 0x31);
      if (pCVar3 == (Curl_addrinfo *)0x0) break;
      pCVar3->ai_addr = (sockaddr *)(pCVar3 + 1);
      __dest = (char *)((long)&pCVar3[1].ai_flags + lVar6);
      pCVar3->ai_canonname = __dest;
      memcpy(__dest,he->h_name,sVar2 + 1);
      if (pCVar8 == (Curl_addrinfo *)0x0) {
        pCVar8 = pCVar3;
      }
      if (pCVar9 != (Curl_addrinfo *)0x0) {
        pCVar9->ai_next = pCVar3;
      }
      iVar7 = he->h_addrtype;
      pCVar3->ai_family = iVar7;
      pCVar3->ai_socktype = 1;
      pCVar3->ai_addrlen = (curl_socklen_t)lVar6;
      if (iVar7 == 10) {
        psVar5 = pCVar3->ai_addr;
        uVar1 = *(undefined8 *)(local_48 + 8);
        *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)local_48;
        psVar5[1].sa_family = (short)uVar1;
        psVar5[1].sa_data[0] = (char)((ulong)uVar1 >> 0x10);
        psVar5[1].sa_data[1] = (char)((ulong)uVar1 >> 0x18);
        psVar5[1].sa_data[2] = (char)((ulong)uVar1 >> 0x20);
        psVar5[1].sa_data[3] = (char)((ulong)uVar1 >> 0x28);
        psVar5[1].sa_data[4] = (char)((ulong)uVar1 >> 0x30);
        psVar5[1].sa_data[5] = (char)((ulong)uVar1 >> 0x38);
LAB_0051c00a:
        iVar7 = he->h_addrtype;
        psVar5->sa_family = (sa_family_t)iVar7;
        *(ushort *)psVar5->sa_data = (ushort)port << 8 | (ushort)port >> 8;
      }
      else if (iVar7 == 2) {
        psVar5 = pCVar3->ai_addr;
        *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)local_48;
        goto LAB_0051c00a;
      }
      local_48 = *(char **)((long)he->h_addr_list + lVar4);
      lVar4 = lVar4 + 8;
      pCVar9 = pCVar3;
      if (local_48 == (char *)0x0) {
        return pCVar8;
      }
    }
    while (pCVar8 != (Curl_addrinfo *)0x0) {
      pCVar9 = pCVar8->ai_next;
      (*Curl_cfree)(pCVar8);
      pCVar8 = pCVar9;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  struct Curl_addrinfo *ai;
  struct Curl_addrinfo *prevai = NULL;
  struct Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i = 0; (curr = he->h_addr_list[i]) != NULL; i++) {
    size_t ss_size;
    size_t namelen = strlen(he->h_name) + 1; /* include null-terminatior */
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
    else
#endif
      ss_size = sizeof(struct sockaddr_in);

    /* allocate memory to hold the struct, the address and the name */
    ai = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ai) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    /* put the address after the struct */
    ai->ai_addr = (void *)((char *)ai + sizeof(struct Curl_addrinfo));
    /* then put the name after the address */
    ai->ai_canonname = (char *)ai->ai_addr + ss_size;
    memcpy(ai->ai_canonname, he->h_name, namelen);

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch(ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (CURL_SA_FAMILY_T)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}